

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_container_rank(array_container_t *arr,uint16_t x)

{
  int32_t iVar1;
  _Bool is_present;
  int32_t idx;
  uint16_t x_local;
  array_container_t *arr_local;
  
  iVar1 = binarySearch(arr->array,arr->cardinality,x);
  if (iVar1 < 0) {
    arr_local._4_4_ = -1 - iVar1;
  }
  else {
    arr_local._4_4_ = iVar1 + 1;
  }
  return arr_local._4_4_;
}

Assistant:

inline int array_container_rank(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx + 1;
    } else {
        return -idx - 1;
    }
}